

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priest.c
# Opt level: O0

void intemple(int roomno)

{
  uint uVar1;
  char cVar2;
  boolean bVar3;
  boolean bVar4;
  int iVar5;
  monst *pmVar6;
  obj *poVar7;
  char *pcVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  char *local_158;
  monst *mtmp;
  char local_138 [4];
  uint save_priest;
  char buf [256];
  char *local_30;
  char *msg2;
  char *msg1;
  boolean can_speak;
  boolean sanctum;
  boolean shrined;
  boolean tended;
  monst *priest;
  int roomno_local;
  
  pmVar6 = findpriest((char)roomno);
  cVar2 = temple_occupied(u.urooms0);
  if (cVar2 != '\0') {
    return;
  }
  if (pmVar6 == (monst *)0x0) {
    iVar5 = rn2(3);
    if (iVar5 == 0) {
      pline("You have an eerie feeling...");
    }
    else if (iVar5 == 1) {
      pline("You feel like you are being watched.");
    }
    else {
      pcVar8 = body_part(0xc);
      pline("A shiver runs down your %s.",pcVar8);
    }
    iVar5 = rn2(5);
    if (iVar5 != 0) {
      return;
    }
    pmVar6 = makemon(mons + 0x12a,level,(int)u.ux,(int)u.uy,0);
    if (pmVar6 == (monst *)0x0) {
      return;
    }
    if (((((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) ||
        ((((pmVar6->data->mflags1 & 0x10000) == 0 &&
          ((poVar7 = which_armor(pmVar6,4), poVar7 == (obj *)0x0 ||
           (poVar7 = which_armor(pmVar6,4), poVar7->otyp != 0x4f)))) &&
         (((((u.uprops[0x1e].intrinsic != 0 ||
             (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
              (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
            ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) &&
           (((u.uprops[0x19].intrinsic != 0 ||
             (((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)) ||
              ((youmonst.data == mons + 0x31 || (youmonst.data == mons + 0x32)))))) &&
            (u.uprops[0x19].blocked == 0)))) ||
          (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
           (iVar5 = dist2((int)pmVar6->mx,(int)pmVar6->my,(int)u.ux,(int)u.uy), iVar5 < 0x41))))))))
       || (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
           (bVar3 = match_warn_of_mon(pmVar6), bVar3 != '\0')))) {
      pline("An enormous ghost appears next to you!");
    }
    else {
      pline("You sense a presence close by!");
    }
    *(uint *)&pmVar6->field_0x60 = *(uint *)&pmVar6->field_0x60 & 0xffbfffff;
    set_malign(pmVar6);
    if (flags.verbose != '\0') {
      pline("You are frightened to death, and unable to move.");
    }
    nomul(-3,"frightened to death");
    nomovemsg = "You regain your composure.";
    return;
  }
  bVar3 = has_shrine(pmVar6);
  bVar4 = on_level(&u.uz,&dungeon_topology.d_sanctum_level);
  bVar9 = bVar4 != '\0';
  bVar10 = u.uz.dnum == dungeon_topology.d_astral_level.dnum;
  bVar11 = false;
  if (((*(uint *)&pmVar6->field_0x60 >> 0x12 & 1) != 0) &&
     (bVar11 = false, (*(uint *)&pmVar6->field_0x60 >> 0x13 & 1) == 0)) {
    bVar11 = flags.soundok != '\0';
  }
  if (!bVar11) goto LAB_002ac4ba;
  uVar1 = *(uint *)&pmVar6->field_0x60;
  if ((bVar9 || bVar10) &&
     (((u.uprops[0x23].intrinsic == 0 || (u.uprops[0x24].extrinsic != 0)) ||
      ((u.umonnum != u.umonster && (bVar4 = dmgtype(youmonst.data,0x24), bVar4 != '\0')))))) {
    *(uint *)&pmVar6->field_0x60 = *(uint *)&pmVar6->field_0x60 & 0xefffffff;
  }
  if (pmVar6->wormno == '\0') {
    if (((viz_array[pmVar6->my][pmVar6->mx] & 2U) != 0) ||
       ((((u.uprops[0x1e].intrinsic == 0 &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        (((u.uprops[0x40].intrinsic != 0 ||
          ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
         (((pmVar6->data->mflags3 & 0x200) != 0 && ((viz_array[pmVar6->my][pmVar6->mx] & 1U) != 0)))
         ))))) goto LAB_002ac3dc;
LAB_002ac477:
    local_158 = "A nearby voice";
  }
  else {
    bVar4 = worm_known(level,pmVar6);
    if (bVar4 == '\0') goto LAB_002ac477;
LAB_002ac3dc:
    if ((((((*(uint *)&pmVar6->field_0x60 >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
         (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
       ((((*(uint *)&pmVar6->field_0x60 >> 7 & 1) != 0 ||
         ((*(uint *)&pmVar6->field_0x60 >> 9 & 1) != 0)) || (((byte)u._1052_1_ >> 5 & 1) != 0))))
    goto LAB_002ac477;
    local_158 = Monnam(pmVar6);
  }
  pline("%s intones:",local_158);
  *(uint *)&pmVar6->field_0x60 =
       *(uint *)&pmVar6->field_0x60 & 0xefffffff | (uVar1 >> 0x1c & 1) << 0x1c;
LAB_002ac4ba:
  local_30 = (char *)0x0;
  if ((bVar9 || bVar10) &&
     (bVar4 = on_level(&u.uz,&dungeon_topology.d_sanctum_level), bVar4 != '\0')) {
    if ((*(uint *)&pmVar6->field_0x60 >> 0x16 & 1) == 0) {
      msg2 = "You desecrate this place by your presence!";
    }
    else {
      msg2 = "Infidel, you have entered Moloch\'s Sanctum!";
      local_30 = "Be gone!";
      *(uint *)&pmVar6->field_0x60 = *(uint *)&pmVar6->field_0x60 & 0xffbfffff;
      set_malign(pmVar6);
    }
  }
  else {
    pcVar8 = "sacred";
    if (bVar3 == '\0') {
      pcVar8 = "desecrated";
    }
    sprintf(local_138,"Pilgrim, you enter a %s place!",pcVar8);
    msg2 = local_138;
  }
  if ((bVar11) && (verbalize(msg2), local_30 != (char *)0x0)) {
    verbalize(local_30);
  }
  if (!bVar9 && !bVar10) {
    if (((bVar3 == '\0') || (bVar4 = p_coaligned(pmVar6), bVar4 == '\0')) || (u.ualign.record < -3))
    {
      pcVar8 = " strange";
      if (bVar3 == '\0') {
        pcVar8 = "";
      }
      pline("You have a%s forbidding feeling...",pcVar8);
    }
    else {
      pline("You experience a strange sense of peace.");
    }
  }
  return;
}

Assistant:

void intemple(int roomno)
{
	struct monst *priest = findpriest((char)roomno);
	boolean tended = (priest != NULL);
	boolean shrined, sanctum, can_speak;
	const char *msg1, *msg2;
	char buf[BUFSZ];

	if (!temple_occupied(u.urooms0)) {
	    if (tended) {
		shrined = has_shrine(priest);
		sanctum = (Is_sanctum(&u.uz) || In_endgame(&u.uz));
		can_speak = (priest->mcanmove && !priest->msleeping &&
			     flags.soundok);
		if (can_speak) {
		    unsigned save_priest = priest->ispriest;
		    /* don't reveal the altar's owner upon temple entry in
		       the endgame; for the Sanctum, the next message names
		       Moloch so suppress the "of Moloch" for him here too */
		    if (sanctum && !Hallucination) priest->ispriest = 0;
		    pline("%s intones:",
			canseemon(level, priest) ? Monnam(priest) : "A nearby voice");
		    priest->ispriest = save_priest;
		}
		msg2 = 0;
		if (sanctum && Is_sanctum(&u.uz)) {
		    if (priest->mpeaceful) {
			msg1 = "Infidel, you have entered Moloch's Sanctum!";
			msg2 = "Be gone!";
			priest->mpeaceful = 0;
			set_malign(priest);
		    } else
			msg1 = "You desecrate this place by your presence!";
		} else {
		    sprintf(buf, "Pilgrim, you enter a %s place!",
			    !shrined ? "desecrated" : "sacred");
		    msg1 = buf;
		}
		if (can_speak) {
		    verbalize(msg1);
		    if (msg2) verbalize(msg2);
		}
		if (!sanctum) {
		    /* !tended -> !shrined */
		    if (!shrined || !p_coaligned(priest) ||
			    u.ualign.record <= ALGN_SINNED)
			pline("You have a%s forbidding feeling...",
				(!shrined) ? "" : " strange");
		    else pline("You experience a strange sense of peace.");
		}
	    } else {
		switch(rn2(3)) {
		  case 0: pline("You have an eerie feeling..."); break;
		  case 1: pline("You feel like you are being watched."); break;
		  default: pline("A shiver runs down your %s.",
			body_part(SPINE)); break;
		}
		if (!rn2(5)) {
		    struct monst *mtmp;

		    if (!(mtmp = makemon(&mons[PM_GHOST], level, u.ux, u.uy, 
			                 NO_MM_FLAGS)))
			return;
		    if (!Blind || sensemon(mtmp))
			pline("An enormous ghost appears next to you!");
		    else pline("You sense a presence close by!");
		    mtmp->mpeaceful = 0;
		    set_malign(mtmp);
		    if (flags.verbose)
			pline("You are frightened to death, and unable to move.");
		    nomul(-3, "frightened to death");
		    nomovemsg = "You regain your composure.";
	       }
	   }
       }
}